

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

bool __thiscall
booster::locale::impl_posix::ctype_posix<wchar_t>::do_is
          (ctype_posix<wchar_t> *this,mask m,wchar_t c)

{
  int iVar1;
  element_type *pp_Var2;
  wint_t in_EDX;
  ushort in_SI;
  wint_t in_stack_ffffffffffffffc0;
  wint_t in_stack_ffffffffffffffc4;
  
  if ((in_SI & 0x2000) != 0) {
    pp_Var2 = std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar1 = iswspace_l(in_EDX,(__locale_t)*pp_Var2);
    if (iVar1 != 0) {
      return true;
    }
  }
  if ((in_SI & 0x4000) != 0) {
    pp_Var2 = std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar1 = iswprint_l(in_EDX,(__locale_t)*pp_Var2);
    if (iVar1 != 0) {
      return true;
    }
  }
  if ((in_SI & 2) != 0) {
    pp_Var2 = std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar1 = iswcntrl_l(in_EDX,(__locale_t)*pp_Var2);
    if (iVar1 != 0) {
      return true;
    }
  }
  if ((in_SI & 0x100) != 0) {
    pp_Var2 = std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar1 = iswupper_l(in_EDX,(__locale_t)*pp_Var2);
    if (iVar1 != 0) {
      return true;
    }
  }
  if ((in_SI & 0x200) != 0) {
    pp_Var2 = std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar1 = iswlower_l(in_EDX,(__locale_t)*pp_Var2);
    if (iVar1 != 0) {
      return true;
    }
  }
  if ((in_SI & 0x400) != 0) {
    pp_Var2 = std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar1 = iswalpha_l(in_EDX,(__locale_t)*pp_Var2);
    if (iVar1 != 0) {
      return true;
    }
  }
  if ((in_SI & 0x800) != 0) {
    in_stack_ffffffffffffffc4 = in_EDX;
    pp_Var2 = std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0));
    iVar1 = iswdigit_l(in_stack_ffffffffffffffc4,(__locale_t)*pp_Var2);
    if (iVar1 != 0) {
      return true;
    }
  }
  if ((in_SI & 0x1000) != 0) {
    in_stack_ffffffffffffffc0 = in_EDX;
    pp_Var2 = std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)CONCAT44(in_stack_ffffffffffffffc4,in_EDX));
    iVar1 = iswxdigit_l(in_stack_ffffffffffffffc0,(__locale_t)*pp_Var2);
    if (iVar1 != 0) {
      return true;
    }
  }
  if ((in_SI & 4) != 0) {
    pp_Var2 = std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar1 = iswpunct_l(in_EDX,(__locale_t)*pp_Var2);
    if (iVar1 != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool do_is(mask m,wchar_t c) const
    {
        if((m & space) && iswspace_l(c,*lc_))
            return true;
        if((m & print) && iswprint_l(c,*lc_))
            return true;
        if((m & cntrl) && iswcntrl_l(c,*lc_))
            return true;
        if((m & upper) && iswupper_l(c,*lc_))
            return true;
        if((m & lower) && iswlower_l(c,*lc_))
            return true;
        if((m & alpha) && iswalpha_l(c,*lc_))
            return true;
        if((m & digit) && iswdigit_l(c,*lc_))
            return true;
        if((m & xdigit) && iswxdigit_l(c,*lc_))
            return true;
        if((m & punct) && iswpunct_l(c,*lc_))
            return true;
        return false;
    }